

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O0

int makesky(int argc,char **argv)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  undefined1 auVar1 [16];
  Allocator alloc;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  bool bVar2;
  undefined1 uVar3;
  ulong uVar4;
  reference pvVar5;
  long *in_RSI;
  undefined8 uVar7;
  undefined1 extraout_var [56];
  undefined1 auVar6 [64];
  XYZ XVar8;
  ImageMetadata metadata;
  XYZ illumXYZ;
  RGBColorSpace *colorSpace;
  ArHosekSkyModelState *skymodel_state;
  int i;
  vector<float,_std::allocator<float>_> lambda;
  int nLambda;
  Image img;
  Vector3f sunDir;
  anon_class_1_0_00000001 onError;
  int resolution;
  Float elevation;
  Float turbidity;
  Float albedo;
  string outfile;
  string *in_stack_fffffffffffff928;
  DenselySampledSpectrum *v_00;
  undefined7 in_stack_fffffffffffff930;
  undefined1 in_stack_fffffffffffff937;
  allocator_type *in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff944;
  size_type in_stack_fffffffffffff948;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffff950;
  char *in_stack_fffffffffffff958;
  allocator<char> *in_stack_fffffffffffff960;
  char *in_stack_fffffffffffff968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff970;
  char *in_stack_fffffffffffff978;
  int in_stack_fffffffffffff984;
  undefined4 in_stack_fffffffffffff988;
  Float in_stack_fffffffffffff98c;
  LogLevel level;
  string *local_650;
  function<void_(long,_long)> *in_stack_fffffffffffffa10;
  undefined7 in_stack_fffffffffffffa18;
  undefined1 in_stack_fffffffffffffa1f;
  allocator<char> *in_stack_fffffffffffffa20;
  ColorEncodingHandle *in_stack_fffffffffffffa40;
  PixelFormat in_stack_fffffffffffffa4c;
  Image *in_stack_fffffffffffffa50;
  undefined7 in_stack_fffffffffffffa58;
  undefined1 in_stack_fffffffffffffa5f;
  bool bVar9;
  undefined1 *in_stack_fffffffffffffa60;
  undefined7 in_stack_fffffffffffffa68;
  undefined1 in_stack_fffffffffffffa6f;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffa70;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffffb00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb08;
  string *in_stack_fffffffffffffb10;
  char ***in_stack_fffffffffffffb18;
  int local_3fc;
  vector<float,_std::allocator<float>_> local_3f0;
  int local_3d4;
  DenselySampledSpectrum *local_3d0;
  undefined1 local_3bc;
  allocator<char> local_3bb;
  allocator<char> local_3ba;
  allocator<char> local_3b9;
  string *local_3b8;
  string local_3b0 [32];
  undefined1 local_390 [32];
  undefined1 local_370 [32];
  string *local_350;
  undefined8 local_348;
  string local_200 [39];
  byte local_1d9;
  byte local_1b3;
  byte local_1b2;
  allocator<char> local_1b1;
  string local_1b0 [39];
  byte local_189;
  function<void_(long,_long)> local_188;
  byte local_163;
  byte local_162;
  allocator<char> local_161;
  string local_160 [39];
  byte local_139;
  byte local_113;
  byte local_112;
  allocator<char> local_111;
  string local_110 [39];
  byte local_e9;
  ColorEncodingHandle local_e8 [4];
  byte local_c3;
  byte local_c2;
  undefined1 local_c1 [33];
  undefined1 local_a0 [55];
  allocator<char> local_69;
  string local_68 [56];
  string local_30 [32];
  long *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30);
  local_68._52_4_ = 0.5;
  local_68._48_4_ = 3.0;
  local_68._44_4_ = 10.0;
  local_68[0x28] = (string)0x0;
  local_68[0x29] = (string)0x8;
  local_68[0x2a] = (string)0x0;
  local_68[0x2b] = (string)0x0;
  while (*local_10 != 0) {
    in_stack_fffffffffffffa70 = (Tuple2<pbrt::Point2,_int>)&local_69;
    std::allocator<char>::allocator();
    local_c2 = 0;
    local_c3 = 0;
    local_e9 = 0;
    local_112 = 0;
    local_113 = 0;
    local_139 = 0;
    local_162 = 0;
    local_163 = 0;
    local_189 = 0;
    local_1b2 = 0;
    local_1b3 = 0;
    local_1d9 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960);
    in_stack_fffffffffffffa60 = local_a0;
    std::function<void(std::__cxx11::string)>::function<makesky(int,char**)::__0&,void>
              ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
               (anon_class_1_0_00000001 *)in_stack_fffffffffffff938);
    in_stack_fffffffffffffa6f =
         pbrt::ParseArg<std::__cxx11::string*>
                   (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                    in_stack_fffffffffffffb00);
    bVar9 = true;
    if (!(bool)in_stack_fffffffffffffa6f) {
      in_stack_fffffffffffffa50 = (Image *)local_c1;
      std::allocator<char>::allocator();
      local_c2 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960);
      local_c3 = 1;
      in_stack_fffffffffffffa40 = local_e8;
      std::function<void(std::__cxx11::string)>::function<makesky(int,char**)::__0&,void>
                ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                 (anon_class_1_0_00000001 *)in_stack_fffffffffffff938);
      local_e9 = 1;
      bVar2 = pbrt::ParseArg<float*>
                        (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
                         (float *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
      in_stack_fffffffffffffa4c = CONCAT13(bVar2,(int3)in_stack_fffffffffffffa4c);
      bVar9 = true;
      if (!bVar2) {
        std::allocator<char>::allocator();
        local_112 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960);
        local_113 = 1;
        std::function<void(std::__cxx11::string)>::function<makesky(int,char**)::__0&,void>
                  ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                   (anon_class_1_0_00000001 *)in_stack_fffffffffffff938);
        local_139 = 1;
        bVar2 = pbrt::ParseArg<float*>
                          (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
                           (float *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
        bVar9 = true;
        if (!bVar2) {
          in_stack_fffffffffffffa20 = &local_161;
          std::allocator<char>::allocator();
          local_162 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960);
          local_163 = 1;
          in_stack_fffffffffffffa10 = &local_188;
          std::function<void(std::__cxx11::string)>::function<makesky(int,char**)::__0&,void>
                    ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                      *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                     (anon_class_1_0_00000001 *)in_stack_fffffffffffff938);
          local_189 = 1;
          in_stack_fffffffffffffa1f =
               pbrt::ParseArg<float*>
                         (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
                          (float *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
          bVar9 = true;
          if (!(bool)in_stack_fffffffffffffa1f) {
            std::allocator<char>::allocator();
            local_1b2 = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960
                      );
            local_1b3 = 1;
            std::function<void(std::__cxx11::string)>::function<makesky(int,char**)::__0&,void>
                      ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                       (anon_class_1_0_00000001 *)in_stack_fffffffffffff938);
            local_1d9 = 1;
            bVar9 = pbrt::ParseArg<int*>
                              (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
                               (int *)in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
          }
        }
      }
    }
    in_stack_fffffffffffffa5f = bVar9;
    if ((local_1d9 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3d16bc);
    }
    if ((local_1b3 & 1) != 0) {
      std::__cxx11::string::~string(local_1b0);
    }
    if ((local_1b2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_1b1);
    }
    if ((local_189 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3d1707);
    }
    if ((local_163 & 1) != 0) {
      std::__cxx11::string::~string(local_160);
    }
    if ((local_162 & 1) != 0) {
      std::allocator<char>::~allocator(&local_161);
    }
    if ((local_139 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3d1752);
    }
    if ((local_113 & 1) != 0) {
      std::__cxx11::string::~string(local_110);
    }
    if ((local_112 & 1) != 0) {
      std::allocator<char>::~allocator(&local_111);
    }
    if ((local_e9 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3d179d);
    }
    if ((local_c3 & 1) != 0) {
      std::__cxx11::string::~string((string *)(local_c1 + 1));
    }
    if ((local_c2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)local_c1);
    }
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                 *)0x3d17dc);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    if (bVar9 == false) {
      pbrt::StringPrintf<char*&>(in_stack_fffffffffffff958,(char **)in_stack_fffffffffffff950);
      makesky::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)
                 CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
                 in_stack_fffffffffffff928);
      std::__cxx11::string::~string(local_200);
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    usage("makesky","--outfile must be specified");
  }
  if (((float)local_68._52_4_ < 0.0) || (1.0 < (float)local_68._52_4_)) {
    usage("makesky","--albedo must be between 0 and 1");
  }
  if (((float)local_68._48_4_ < 1.7) || (10.0 < (float)local_68._48_4_)) {
    usage("makesky","--turbidity must be between 1.7 and 10.");
  }
  if (((float)local_68._44_4_ < 0.0) || (90.0 < (float)local_68._44_4_)) {
    usage("makesky","--elevation must be between 0. and 90.");
  }
  local_68._44_4_ = pbrt::Radians((Float)local_68._44_4_);
  if ((int)local_68._40_4_ < 1) {
    usage("makesky","--resolution must be >= 1");
  }
  std::cos((double)(ulong)(uint)local_68._44_4_);
  std::sin((double)(ulong)(uint)local_68._44_4_);
  pbrt::Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
             (float)((ulong)in_stack_fffffffffffff928 >> 0x20),SUB84(in_stack_fffffffffffff928,0),
             0.0);
  pbrt::Point2<int>::Point2
            ((Point2<int> *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
             (int)((ulong)in_stack_fffffffffffff928 >> 0x20),(int)in_stack_fffffffffffff928);
  local_3bc = 1;
  local_3b8 = local_3b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  local_3b8 = (string *)local_390;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  local_3b8 = (string *)local_370;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960);
  local_3bc = 0;
  local_350 = local_3b0;
  local_348 = 3;
  v._M_len._0_4_ = in_stack_fffffffffffff940;
  v._M_array = (iterator)in_stack_fffffffffffff938;
  v._M_len._4_4_ = in_stack_fffffffffffff944;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),v);
  pbrt::ColorEncodingHandle::TaggedPointer
            ((ColorEncodingHandle *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
             in_stack_fffffffffffff928);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)
             CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  channels.n._0_7_ = in_stack_fffffffffffffa68;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa60;
  channels.n._7_1_ = in_stack_fffffffffffffa6f;
  alloc.memoryResource._7_1_ = in_stack_fffffffffffffa5f;
  alloc.memoryResource._0_7_ = in_stack_fffffffffffffa58;
  pbrt::Image::Image(in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c,
                     (Point2i)in_stack_fffffffffffffa70,channels,in_stack_fffffffffffffa40,alloc);
  local_650 = (string *)&local_350;
  v_00 = local_3d0;
  do {
    local_650 = local_650 + -0x20;
    std::__cxx11::string::~string(local_650);
  } while (local_650 != local_3b0);
  std::allocator<char>::~allocator(&local_3bb);
  std::allocator<char>::~allocator(&local_3ba);
  auVar6._0_8_ = std::allocator<char>::~allocator(&local_3b9);
  auVar6._8_56_ = extraout_var;
  local_3d4 = 0xd;
  uVar7 = 0;
  std::allocator<float>::allocator((allocator<float> *)0x3d1eee);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffff950,in_stack_fffffffffffff948,
             (value_type *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
             in_stack_fffffffffffff938);
  std::allocator<float>::~allocator((allocator<float> *)0x3d1f1c);
  for (local_3fc = 0; level = (LogLevel)((ulong)uVar7 >> 0x20), local_3fc < local_3d4;
      local_3fc = local_3fc + 1) {
    in_stack_fffffffffffff98c = pbrt::Lerp((float)local_3fc / (float)(local_3d4 + -1),320.0,720.0);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&local_3f0,(long)local_3fc);
    auVar6 = ZEXT464((uint)in_stack_fffffffffffff98c);
    *pvVar5 = in_stack_fffffffffffff98c;
  }
  uVar7 = auVar6._8_8_;
  arhosekskymodelstate_alloc_init
            ((double)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
             (double)in_stack_fffffffffffff938,
             (double)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  pbrt::SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
            ((SpectrumHandle *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),v_00);
  XVar8 = pbrt::SpectrumToXYZ((SpectrumHandle *)local_650);
  auVar1._8_8_ = uVar7;
  auVar1._0_8_ = XVar8._0_8_;
  vmovlpd_avx(auVar1);
  std::function<void(long,long)>::function<makesky(int,char**)::__1,void>
            ((function<void_(long,_long)> *)CONCAT44(XVar8.Z,in_stack_fffffffffffff940),
             (anon_class_48_6_2b3e5515 *)(long)(int)local_68._40_4_);
  pbrt::ParallelFor((int64_t)in_stack_fffffffffffffa20,
                    CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                    in_stack_fffffffffffffa10);
  std::function<void_(long,_long)>::~function((function<void_(long,_long)> *)0x3d2266);
  pbrt::ImageMetadata::ImageMetadata
            ((ImageMetadata *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  pstd::optional<const_pbrt::RGBColorSpace_*>::operator=
            ((optional<const_pbrt::RGBColorSpace_*> *)
             CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),(RGBColorSpace **)v_00);
  uVar3 = pbrt::Image::Write((Image *)metadata.NDCFromWorld.optionalValue._4_8_,
                             (string *)metadata._72_8_,
                             (ImageMetadata *)metadata.cameraFromWorld.optionalValue._56_8_);
  if ((bool)uVar3) {
    pbrt::ImageMetadata::~ImageMetadata((ImageMetadata *)CONCAT17(uVar3,in_stack_fffffffffffff930));
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)CONCAT44(XVar8.Z,in_stack_fffffffffffff940))
    ;
    pbrt::Image::~Image((Image *)CONCAT17(uVar3,in_stack_fffffffffffff930));
    std::__cxx11::string::~string(local_30);
    return 0;
  }
  pbrt::LogFatal<char_const(&)[29]>
            (level,(char *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
             in_stack_fffffffffffff984,in_stack_fffffffffffff978,
             (char (*) [29])in_stack_fffffffffffff970);
}

Assistant:

int makesky(int argc, char *argv[]) {
    std::string outfile;
    Float albedo = 0.5;
    Float turbidity = 3.;
    Float elevation = 10;
    int resolution = 2048;

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("makesky", "%s", err.c_str());
            exit(1);
        };
        if (ParseArg(&argv, "outfile", &outfile, onError) ||
            ParseArg(&argv, "albedo", &albedo, onError) ||
            ParseArg(&argv, "turbidity", &turbidity, onError) ||
            ParseArg(&argv, "elevation", &elevation, onError) ||
            ParseArg(&argv, "resolution", &resolution, onError)) {
            // success
        } else
            onError(StringPrintf("argument %s invalid", *argv));
    }

    if (outfile.empty())
        usage("makesky", "--outfile must be specified");
    if (albedo < 0. || albedo > 1.)
        usage("makesky", "--albedo must be between 0 and 1");
    if (turbidity < 1.7 || turbidity > 10.)
        usage("makesky", "--turbidity must be between 1.7 and 10.");
    if (elevation < 0. || elevation > 90.)
        usage("makesky", "--elevation must be between 0. and 90.");
    elevation = Radians(elevation);
    if (resolution < 1)
        usage("makesky", "--resolution must be >= 1");

    // Vector pointing at the sun. Note that elevation is measured from the
    // horizon--not the zenith, as it is elsewhere in pbrt.
    Vector3f sunDir(0., std::cos(elevation), std::sin(elevation));

    Image img(PixelFormat::Float, {resolution, resolution}, {"R", "G", "B"});

    // They assert wavelengths are in this range...
    int nLambda = 1 + (720 - 320) / 32;
    std::vector<Float> lambda(nLambda, Float(0));
    for (int i = 0; i < nLambda; ++i)
        lambda[i] = Lerp(i / Float(nLambda - 1), 320, 720);

    // Assume a uniform spectral albedo
    ArHosekSkyModelState *skymodel_state =
        arhosekskymodelstate_alloc_init(elevation, turbidity, albedo);

    const RGBColorSpace *colorSpace = RGBColorSpace::ACES2065_1;
    XYZ illumXYZ = SpectrumToXYZ(&colorSpace->illuminant);

    ParallelFor(0, resolution, [&](int64_t start, int64_t end) {
        std::vector<Float> skyv(lambda.size());
        for (int64_t iy = start; iy < end; ++iy) {
            Float y = (iy + 0.5f) / resolution;
            for (int ix = 0; ix < resolution; ++ix) {
                Float x = (ix + 0.5f) / resolution;
                Vector3f v = EqualAreaSquareToSphere({x, y});
                if (v.z <= 0)
                    // downward hemisphere
                    continue;

                Float theta = SphericalTheta(v);

                // Compute the angle between the pixel's direction and the sun
                // direction.
                Float gamma = SafeACos(Dot(v, sunDir));
                DCHECK(gamma >= 0 && gamma <= Pi);

                for (int i = 0; i < lambda.size(); ++i)
                    skyv[i] = arhosekskymodel_solar_radiance(skymodel_state, theta, gamma,
                                                             lambda[i]);

                PiecewiseLinearSpectrum spec(pstd::MakeConstSpan(lambda),
                                             pstd::MakeConstSpan(skyv));
                XYZ xyz = SpectrumToXYZ(&spec);
                RGB rgb = colorSpace->ToRGB(xyz);

                for (int c = 0; c < 3; ++c)
                    img.SetChannel({ix, int(iy)}, c, rgb[c]);
            }
        }
    });

    ImageMetadata metadata;
    metadata.colorSpace = colorSpace;
    CHECK(img.Write(outfile, metadata));

    return 0;
}